

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O3

void use_shared_pointer(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *poVar2;
  long lVar3;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  films [5];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar1,"The Iron Man","");
  local_68 = pbVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_60,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar1,"The amazing four","");
  local_58 = pbVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_50,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar1,"Capital America","");
  local_48 = pbVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_40,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar1,"The spiderman","");
  local_38 = pbVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_30,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar1,"The superman","");
  local_28 = pbVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_20,pbVar1);
  pbVar1 = local_48;
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_70,&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The mavel movies are:\n",0x16);
  lVar3 = 0;
  do {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)**(undefined8 **)((long)&local_68 + lVar3),
                        (*(undefined8 **)((long)&local_68 + lVar3))[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The winner is ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!\n",2);
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  lVar3 = 0x50;
  do {
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_70._M_pi + lVar3);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  return;
}

Assistant:

void use_shared_pointer() {
    using namespace std;

    shared_ptr<string> films[5] = {
            shared_ptr<string>(new string("The Iron Man")),
            shared_ptr<string>(new string("The amazing four")),
            shared_ptr<string>(new string("Capital America")),
            shared_ptr<string>(new string("The spiderman")),
            shared_ptr<string>(new string("The superman")),
    };

    shared_ptr<string> pwin;
    //  point to same string, reference count ++
    pwin = films[2];

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        std::cout << *films[i] << std::endl;
    }
    std::cout << "The winner is " << *pwin << "!\n";
//    cin.get();
}